

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

string * CLI::detail::binary_escape_string(string *__return_storage_ptr__,string *string_to_escape)

{
  byte __c;
  __type _Var1;
  int iVar2;
  size_type sVar3;
  char *__rhs;
  size_type sVar4;
  allocator<char> local_249;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_248;
  pointer local_240;
  string code;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream stream;
  long local_1a8 [3];
  uint auStack_190 [88];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_240 = (string_to_escape->_M_dataplus)._M_p;
  sVar3 = string_to_escape->_M_string_length;
  local_248 = string_to_escape;
  for (sVar4 = 0; sVar3 != sVar4; sVar4 = sVar4 + 1) {
    __c = local_240[sVar4];
    iVar2 = isprint((uint)__c);
    if (iVar2 == 0) {
      ::std::__cxx11::stringstream::stringstream((stringstream *)&stream);
      *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
           *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
      ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"\\x",&local_249);
      __rhs = "";
      if (code._M_string_length < 2) {
        __rhs = "0";
      }
      ::std::operator+(&local_1f8,&local_218,__rhs);
      ::std::operator+(&local_1d8,&local_1f8,&code);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&local_1d8);
      ::std::__cxx11::string::~string((string *)&local_1d8);
      ::std::__cxx11::string::~string((string *)&local_1f8);
      ::std::__cxx11::string::~string((string *)&local_218);
      ::std::__cxx11::string::~string((string *)&code);
      ::std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (__return_storage_ptr__,__c);
    }
  }
  _Var1 = ::std::operator==(__return_storage_ptr__,local_248);
  if (!_Var1) {
    while (sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   find(__return_storage_ptr__,'\'',0), sVar3 != 0xffffffffffffffff) {
      (__return_storage_ptr__->_M_dataplus)._M_p[sVar3] = '\\';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                (__return_storage_ptr__,sVar3 + 1,"x27");
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
              (__return_storage_ptr__,0,"\'B\"(");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__return_storage_ptr__,')');
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__return_storage_ptr__,'\"');
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__return_storage_ptr__,'\'');
  }
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string binary_escape_string(const std::string &string_to_escape) {
    // s is our escaped output string
    std::string escaped_string{};
    // loop through all characters
    for(char c : string_to_escape) {
        // check if a given character is printable
        // the cast is necessary to avoid undefined behaviour
        if(isprint(static_cast<unsigned char>(c)) == 0) {
            std::stringstream stream;
            // if the character is not printable
            // we'll convert it to a hex string using a stringstream
            // note that since char is signed we have to cast it to unsigned first
            stream << std::hex << static_cast<unsigned int>(static_cast<unsigned char>(c));
            std::string code = stream.str();
            escaped_string += std::string("\\x") + (code.size() < 2 ? "0" : "") + code;

        } else {
            escaped_string.push_back(c);
        }
    }
    if(escaped_string != string_to_escape) {
        auto sqLoc = escaped_string.find('\'');
        while(sqLoc != std::string::npos) {
            escaped_string[sqLoc] = '\\';
            escaped_string.insert(sqLoc + 1, "x27");
            sqLoc = escaped_string.find('\'');
        }
        escaped_string.insert(0, "'B\"(");
        escaped_string.push_back(')');
        escaped_string.push_back('"');
        escaped_string.push_back('\'');
    }
    return escaped_string;
}